

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msg32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  long in_RDI;
  code *in_R8;
  undefined8 in_R9;
  secp256k1_scalar *unaff_retaddr;
  secp256k1_scalar *in_stack_00000008;
  uint count;
  uchar nonce32 [32];
  int overflow;
  int ret;
  secp256k1_scalar msg;
  secp256k1_scalar non;
  secp256k1_scalar sec;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uchar *in_stack_fffffffffffffef8;
  secp256k1_scalar *in_stack_ffffffffffffff00;
  int local_dc;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  undefined8 local_38;
  code *local_30;
  long local_28;
  long local_20;
  secp256k1_ecdsa_signature *local_18;
  int local_4;
  
  local_dc = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 8));
  if (iVar1 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    local_4 = 0;
  }
  else if (local_20 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    local_4 = 0;
  }
  else if (local_18 == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    local_4 = 0;
  }
  else if (local_28 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    local_4 = 0;
  }
  else {
    if (local_30 == (code *)0x0) {
      local_30 = nonce_function_rfc6979;
    }
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    iVar1 = secp256k1_scalar_is_zero(&local_98);
    if (iVar1 == 0) {
      iVar1 = 0;
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (int *)(ulong)in_stack_fffffffffffffef0);
      while (local_dc = (*local_30)(&stack0xfffffffffffffef8,local_20,local_28,0,local_38,iVar1),
            local_dc != 0) {
        secp256k1_scalar_set_b32
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   (int *)CONCAT44(iVar1,in_stack_fffffffffffffef0));
        iVar2 = secp256k1_scalar_is_zero(&local_b8);
        if ((iVar2 == 0) &&
           (iVar2 = secp256k1_ecdsa_sig_sign
                              ((secp256k1_ecmult_gen_context *)nonce32._24_8_,
                               (secp256k1_scalar *)nonce32._16_8_,(secp256k1_scalar *)nonce32._8_8_,
                               (secp256k1_scalar *)nonce32._0_8_,in_stack_00000008,unaff_retaddr,
                               (int *)msg.d[0]), iVar2 != 0)) break;
        iVar1 = iVar1 + 1;
      }
      memset(&stack0xfffffffffffffef8,0,0x20);
      secp256k1_scalar_clear(&local_d8);
      secp256k1_scalar_clear(&local_b8);
      secp256k1_scalar_clear(&local_98);
    }
    if (local_dc == 0) {
      memset(local_18,0,0x40);
    }
    else {
      secp256k1_ecdsa_signature_save(local_18,&local_58,&local_78);
    }
    local_4 = local_dc;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    /* Fail if the secret key is invalid. */
    if (!overflow && !secp256k1_scalar_is_zero(&sec)) {
        unsigned char nonce32[32];
        unsigned int count = 0;
        secp256k1_scalar_set_b32(&msg, msg32, NULL);
        while (1) {
            ret = noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            if (!overflow && !secp256k1_scalar_is_zero(&non)) {
                if (secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, &r, &s, &sec, &msg, &non, NULL)) {
                    break;
                }
            }
            count++;
        }
        memset(nonce32, 0, 32);
        secp256k1_scalar_clear(&msg);
        secp256k1_scalar_clear(&non);
        secp256k1_scalar_clear(&sec);
    }
    if (ret) {
        secp256k1_ecdsa_signature_save(signature, &r, &s);
    } else {
        memset(signature, 0, sizeof(*signature));
    }
    return ret;
}